

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_integer_attribute_decoder.cc
# Opt level: O3

void __thiscall
draco::SequentialIntegerAttributeDecoder::StoreTypedValues<unsigned_int>
          (SequentialIntegerAttributeDecoder *this,uint32_t num_values)

{
  byte bVar1;
  PointAttribute *pPVar2;
  void *__src;
  ulong uVar3;
  int iVar4;
  long lVar5;
  uint32_t uVar6;
  ulong __n;
  long local_40;
  
  bVar1 = (((this->super_SequentialAttributeDecoder).attribute_)->super_GeometryAttribute).
          num_components_;
  __n = (ulong)((uint)bVar1 * 4);
  __src = operator_new__(__n);
  pPVar2 = (this->super_SequentialAttributeDecoder).portable_attribute_._M_t.
           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
           .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
  if (pPVar2->num_unique_entries_ == 0) {
    local_40 = 0;
  }
  else {
    local_40 = *(long *)(pPVar2->super_GeometryAttribute).buffer_ +
               (pPVar2->super_GeometryAttribute).byte_offset_;
  }
  if (num_values != 0) {
    lVar5 = 0;
    iVar4 = 0;
    uVar6 = 0;
    do {
      if ((ulong)bVar1 != 0) {
        uVar3 = 0;
        do {
          *(undefined4 *)((long)__src + uVar3 * 4) =
               *(undefined4 *)(local_40 + (long)iVar4 * 4 + uVar3 * 4);
          uVar3 = uVar3 + 1;
        } while (bVar1 != uVar3);
        iVar4 = iVar4 + (int)uVar3;
      }
      memcpy((void *)(*(long *)&(((((this->super_SequentialAttributeDecoder).attribute_)->
                                  attribute_buffer_)._M_t.
                                  super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>
                                  .super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl)->
                                data_).
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> +
                     lVar5),__src,__n);
      lVar5 = lVar5 + __n;
      uVar6 = uVar6 + 1;
    } while (uVar6 != num_values);
  }
  operator_delete__(__src);
  return;
}

Assistant:

void SequentialIntegerAttributeDecoder::StoreTypedValues(uint32_t num_values) {
  const int num_components = attribute()->num_components();
  const int entry_size = sizeof(AttributeTypeT) * num_components;
  const std::unique_ptr<AttributeTypeT[]> att_val(
      new AttributeTypeT[num_components]);
  const int32_t *const portable_attribute_data = GetPortableAttributeData();
  int val_id = 0;
  int out_byte_pos = 0;
  for (uint32_t i = 0; i < num_values; ++i) {
    for (int c = 0; c < num_components; ++c) {
      const AttributeTypeT value =
          static_cast<AttributeTypeT>(portable_attribute_data[val_id++]);
      att_val[c] = value;
    }
    // Store the integer value into the attribute buffer.
    attribute()->buffer()->Write(out_byte_pos, att_val.get(), entry_size);
    out_byte_pos += entry_size;
  }
}